

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

bool soul::AST::isResolvedAsConstant(Expression *e)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  long local_20;
  
  if (e->kind == value) {
    iVar1 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[3])(e);
    cVar2 = (char)iVar1;
  }
  else {
    cVar2 = '\0';
  }
  if (cVar2 == '\0') {
    bVar3 = false;
  }
  else {
    (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_20,e);
    bVar3 = local_20 != 0;
  }
  return bVar3;
}

Assistant:

static bool isResolvedAsConstant (Expression& e)             { return isResolvedAsValue (e) && e.getAsConstant() != nullptr; }